

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_dofile(lua_State *L)

{
  int iVar1;
  GCstr *local_28;
  GCstr *fname;
  lua_State *L_local;
  
  local_28 = lj_lib_optstr(L,1);
  L->top->u64 = 0xffffffffffffffff;
  L->top = L->base + 1;
  if (local_28 == (GCstr *)0x0) {
    local_28 = (GCstr *)0x0;
  }
  else {
    local_28 = local_28 + 1;
  }
  iVar1 = luaL_loadfile(L,(char *)local_28);
  if (iVar1 != 0) {
    lua_error(L);
  }
  lua_call(L,0,-1);
  return (int)((long)L->top - (long)L->base >> 3) + -1;
}

Assistant:

LJLIB_CF(dofile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  setnilV(L->top);
  L->top = L->base+1;
  if (luaL_loadfile(L, fname ? strdata(fname) : NULL) != LUA_OK)
    lua_error(L);
  lua_call(L, 0, LUA_MULTRET);
  return (int)(L->top - L->base) - 1;
}